

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O3

void __thiscall crnlib::qdxt1::pack_endpoints_task(qdxt1 *this,uint64 data,void *param_2)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  vector<unsigned_int> *pvVar5;
  raw_node *prVar6;
  dxt_pixel_block *pdVar7;
  dxt1_block *pdVar8;
  bool bVar9;
  crn_thread_id_t cVar10;
  uchar *puVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  cluster_id *pcVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  color_quad<unsigned_char,_int> *pcVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  cluster_id cid;
  uint high_color;
  uint low_color;
  scoped_spinlock lock;
  insert_result result;
  vector<unsigned_char> selectors;
  vector<crnlib::color_quad<unsigned_char,_int>_> cluster_pixels;
  results r;
  dxt1_endpoint_optimizer optimizer;
  uint local_b20;
  cluster_id local_b18;
  ulong local_af8;
  uint local_aec;
  uint local_ae8;
  uint local_ae4;
  spinlock *local_ae0;
  uint local_ad4;
  uint local_ad0;
  uint local_acc;
  uint local_ac8;
  uint local_ac4;
  uint local_ac0;
  uint local_abc;
  insert_result local_ab8;
  vector<unsigned_char> local_a98;
  vector<crnlib::color_quad<unsigned_char,_int>_> local_a88;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  *local_a70;
  uint local_a64;
  uint local_a60;
  int local_a5c;
  uint local_a58;
  uint local_a54;
  uint local_a50;
  uint local_a4c;
  params local_a48;
  uint64 local_a20;
  ulong local_a18;
  qdxt1 *local_a10;
  ulong local_a08;
  ulong local_a00;
  dxt1_block *local_9f8;
  results local_9f0;
  dxt1_endpoint_optimizer local_9d0;
  
  local_a88.m_p = (color_quad_u8 *)0x0;
  local_a88.m_size = 0;
  local_a88.m_capacity = 0;
  vector<crnlib::color_quad<unsigned_char,_int>_>::reserve(&local_a88,0x400);
  local_a98.m_p = (uint8 *)0x0;
  local_a98.m_size = 0;
  local_a98.m_capacity = 0;
  vector<unsigned_char>::reserve(&local_a98,0x400);
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&local_9d0);
  local_a48.m_block_index = 0;
  local_a48.m_pPixels = (color_quad_u8 *)0x0;
  local_a48.m_num_pixels = 0;
  local_a48.m_pixels_have_alpha = false;
  local_a48.m_grayscale_sampling = false;
  local_a48.m_endpoint_caching = true;
  local_a48.m_use_transparent_indices_for_black = false;
  local_a48.m_force_alpha_blocks = false;
  local_9f0.m_pSelectors = (uint8 *)0x0;
  local_a48.m_quality = (this->m_params).m_dxt_quality;
  local_a48.m_use_alpha_blocks = (this->m_params).m_use_alpha_blocks;
  local_a48.m_dxt1a_alpha_threshold = (this->m_params).m_dxt1a_alpha_threshold;
  local_a48.m_perceptual = (this->m_params).m_perceptual;
  uVar28 = (this->m_endpoint_cluster_indices).m_size;
  uVar13 = uVar28 / 100 - 1;
  uVar13 = uVar13 >> 0x10 | uVar13;
  uVar13 = uVar13 >> 8 | uVar13;
  uVar13 = uVar13 >> 4 | uVar13;
  uVar13 = uVar13 >> 2 | uVar13;
  uVar23 = (uVar13 >> 1 | uVar13) + 1 >> 1;
  uVar13 = 8;
  if (8 < uVar23) {
    uVar13 = uVar23;
  }
  local_b18.m_hash = 0;
  local_b18.m_cells.m_p = (uint *)0x0;
  local_b18.m_cells.m_size = 0;
  local_b18.m_cells.m_capacity = 0;
  if (uVar28 != 0) {
    local_ae0 = &this->m_cluster_hash_lock;
    local_a70 = &this->m_cluster_hash;
    local_af8 = 0;
    local_a20 = data;
    local_a10 = this;
    do {
      if ((this->m_canceled != false) ||
         (((((uint)local_af8 & uVar13 - 1) == 0 &&
           (cVar10 = crn_get_current_thread_id(), cVar10 == this->m_main_thread_id)) &&
          (bVar9 = update_progress(this,(uint)local_af8,
                                   (this->m_endpoint_cluster_indices).m_size - 1), !bVar9)))) break;
      uVar12 = local_af8;
      uVar31 = this->m_pTask_pool->m_num_threads;
      if ((uVar31 == 0) || ((int)((local_af8 & 0xffffffff) % (ulong)(uVar31 + 1)) == (int)data)) {
        pvVar5 = (this->m_endpoint_cluster_indices).m_p;
        uVar28 = pvVar5[local_af8].m_size * 0x10;
        if (local_a98.m_size != uVar28) {
          if (local_a98.m_size <= uVar28) {
            if (local_a98.m_capacity < uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_a98,uVar28,local_a98.m_size + 1 == uVar28,1,
                         (object_mover)0x0,false);
            }
            memset(local_a98.m_p + local_a98.m_size,0,(ulong)(uVar28 - local_a98.m_size));
          }
          local_a98.m_size = uVar28;
        }
        cluster_id::set(&local_b18,pvVar5 + uVar12);
        spinlock::lock(local_ae0);
        if ((this->m_cluster_hash).m_num_valid == 0) {
LAB_00138994:
          uVar31 = (this->m_cluster_hash).m_values.m_size;
        }
        else {
          uVar28 = (uint)((int)local_b18.m_hash * -0x61c88647) >>
                   ((byte)(this->m_cluster_hash).m_hash_shift & 0x1f);
          uVar12 = (ulong)uVar28;
          prVar6 = (this->m_cluster_hash).m_values.m_p;
          if (prVar6[uVar12].m_bits[0x1c] == '\0') goto LAB_00138994;
          pcVar19 = (cluster_id *)(prVar6 + uVar12);
          bVar9 = cluster_id::operator==(pcVar19,&local_b18);
          uVar31 = uVar28;
          while (!bVar9) {
            if ((int)uVar12 == 0) {
              uVar12 = (ulong)((this->m_cluster_hash).m_values.m_size - 1);
              pcVar19 = (cluster_id *)((this->m_cluster_hash).m_values.m_p + uVar12);
            }
            else {
              uVar12 = (ulong)((int)uVar12 - 1);
              pcVar19 = (cluster_id *)&pcVar19[-2].m_hash;
            }
            uVar31 = (uint)uVar12;
            if ((uVar31 == uVar28) || (*(char *)((long)&pcVar19[1].m_cells.m_p + 4) == '\0'))
            goto LAB_00138994;
            bVar9 = cluster_id::operator==(pcVar19,&local_b18);
          }
        }
        uVar15 = (this->m_cluster_hash).m_values.m_size;
        local_b20 = 0;
        if (uVar31 != uVar15) {
          local_b20 = *(uint *)((local_a70->m_values).m_p[uVar31].m_bits + 0x18);
        }
        spinlock::unlock(local_ae0);
        if (uVar31 == uVar15) {
          uVar15 = local_b18.m_cells.m_size << 4;
          uVar31 = local_b18.m_cells.m_size;
          if (local_a88.m_size != uVar15) {
            if ((local_a88.m_size <= uVar15) && (local_a88.m_capacity < uVar15)) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_a88,uVar15,local_a88.m_size + 1 == uVar15,4,
                         (object_mover)0x0,false);
              uVar31 = local_b18.m_cells.m_size;
            }
            local_a88.m_size = uVar15;
          }
          if (uVar31 == 0) {
            bVar9 = false;
          }
          else {
            uVar12 = 0;
            bVar9 = false;
            pcVar26 = local_a88.m_p;
            do {
              uVar28 = local_b18.m_cells.m_p[uVar12];
              pdVar7 = this->m_pBlocks;
              lVar14 = 0;
              do {
                if ((uint)pdVar7[uVar28].m_pixels[0][0].field_0.c[lVar14 + 3] <
                    (this->m_params).m_dxt1a_alpha_threshold) {
                  bVar9 = true;
                }
                (pcVar26->field_0).c[lVar14] = pdVar7[uVar28].m_pixels[0][0].field_0.c[lVar14];
                (pcVar26->field_0).c[lVar14 + 1] =
                     pdVar7[uVar28].m_pixels[0][0].field_0.c[lVar14 + 1];
                (pcVar26->field_0).c[lVar14 + 2] =
                     pdVar7[uVar28].m_pixels[0][0].field_0.c[lVar14 + 2];
                (pcVar26->field_0).c[lVar14 + 3] =
                     pdVar7[uVar28].m_pixels[0][0].field_0.c[lVar14 + 3];
                lVar14 = lVar14 + 4;
              } while (lVar14 != 0x40);
              uVar12 = uVar12 + 1;
              pcVar26 = pcVar26 + 0x10;
            } while (uVar12 < (local_b18.m_cells._8_8_ & 0xffffffff));
            uVar15 = local_a88.m_size;
          }
          local_a48.m_block_index = (uint)local_af8;
          local_a48.m_pPixels = local_a88.m_p;
          local_9f0.m_pSelectors = local_a98.m_p;
          local_a48.m_num_pixels = uVar15;
          if (((this->m_params).m_dxt_quality != cCRNDXTQualitySuperFast) || (bVar9)) {
            local_a48.m_pixels_have_alpha = bVar9;
            dxt1_endpoint_optimizer::compute(&local_9d0,&local_a48,&local_9f0);
            local_ae4 = (uint)local_9f0.m_low_color;
            local_ae8 = (uint)local_9f0.m_high_color;
          }
          else {
            dxt_fast::compress_color_block
                      (uVar15,local_a88.m_p,&local_ae4,&local_ae8,local_a98.m_p,true);
          }
          if (local_b18.m_cells.m_size != 0) {
            uVar12 = 0;
            puVar11 = local_a98.m_p;
            do {
              pdVar8 = this->m_pDst_elements;
              uVar28 = this->m_elements_per_block * local_b18.m_cells.m_p[uVar12];
              *(undefined2 *)pdVar8[uVar28].m_low_color = (undefined2)local_ae4;
              *(undefined2 *)pdVar8[uVar28].m_high_color = (undefined2)local_ae8;
              uVar23 = 0;
              lVar14 = 0x10;
              do {
                uVar18 = uVar23 << 2;
                uVar23 = puVar11[lVar14 + -1] | uVar18;
                lVar14 = lVar14 + -1;
              } while (lVar14 != 0);
              puVar11 = puVar11 + 0x10;
              pdVar8[uVar28].m_selectors[0] = (uint8)uVar23;
              pdVar8[uVar28].m_selectors[1] = (uint8)(uVar18 >> 8);
              pdVar8[uVar28].m_selectors[2] = (uint8)(uVar18 >> 0x10);
              pdVar8[uVar28].m_selectors[3] = (uint8)(uVar18 >> 0x18);
              uVar12 = uVar12 + 1;
            } while (uVar12 < (local_b18.m_cells._8_8_ & 0xffffffff));
          }
          spinlock::lock(local_ae0);
          local_abc = local_ae8 << 0x10 | local_ae4;
          local_ab8.first.m_pTable = (hash_map_type *)0x0;
          local_ab8.first.m_index = 0;
          local_ab8.second = false;
          if ((this->m_cluster_hash).m_values.m_size == 0) {
LAB_00139021:
            uVar31 = (this->m_cluster_hash).m_values.m_size * 2;
            if (uVar31 < 5) {
              uVar31 = 4;
            }
            hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
            ::rehash(local_a70,uVar31);
            bVar9 = hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                    ::insert_no_grow(local_a70,&local_ab8,&local_b18,&local_abc);
            if (!bVar9) {
              crnlib_fail("\"insert() failed\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                          ,0x204);
            }
          }
          else {
            uVar28 = (uint)((int)local_b18.m_hash * -0x61c88647) >>
                     ((byte)(this->m_cluster_hash).m_hash_shift & 0x1f);
            prVar6 = (this->m_cluster_hash).m_values.m_p;
            pcVar19 = (cluster_id *)(prVar6 + uVar28);
            if (prVar6[uVar28].m_bits[0x1c] == '\0') {
LAB_00138fc0:
              if ((this->m_cluster_hash).m_grow_threshold <= (this->m_cluster_hash).m_num_valid)
              goto LAB_00139021;
              (pcVar19->m_cells).m_p = (uint *)0x0;
              (pcVar19->m_cells).m_size = 0;
              (pcVar19->m_cells).m_capacity = 0;
              elemental_vector::increase_capacity
                        ((elemental_vector *)pcVar19,local_b18.m_cells.m_size,false,4,
                         (object_mover)0x0,false);
              (pcVar19->m_cells).m_size = local_b18.m_cells.m_size;
              memcpy((pcVar19->m_cells).m_p,local_b18.m_cells.m_p,
                     (local_b18.m_cells._8_8_ & 0xffffffff) << 2);
              pcVar19->m_hash = local_b18.m_hash;
              *(uint *)&pcVar19[1].m_cells.m_p = local_abc;
              *(undefined1 *)((long)&pcVar19[1].m_cells.m_p + 4) = 1;
              puVar1 = &(this->m_cluster_hash).m_num_valid;
              *puVar1 = *puVar1 + 1;
            }
            else {
              bVar9 = cluster_id::operator==(pcVar19,&local_b18);
              if (!bVar9) {
                uVar12 = (ulong)uVar28;
                do {
                  if ((int)uVar12 == 0) {
                    uVar12 = (ulong)((this->m_cluster_hash).m_values.m_size - 1);
                    pcVar19 = (cluster_id *)((this->m_cluster_hash).m_values.m_p + uVar12);
                  }
                  else {
                    uVar12 = (ulong)((int)uVar12 - 1);
                    pcVar19 = (cluster_id *)&pcVar19[-2].m_hash;
                  }
                  if (uVar28 == (uint)uVar12) goto LAB_00139021;
                  if (*(char *)((long)&pcVar19[1].m_cells.m_p + 4) == '\0') goto LAB_00138fc0;
                  bVar9 = cluster_id::operator==(pcVar19,&local_b18);
                } while (!bVar9);
              }
            }
          }
          spinlock::unlock(local_ae0);
        }
        else {
          local_aec = local_b20 >> 0x10;
          dxt1_block::get_block_colors
                    ((color_quad_u8 *)&local_ab8,(uint16)local_b20,(uint16)(local_b20 >> 0x10));
          data = local_a20;
          if (local_b18.m_cells.m_size != 0) {
            local_ac8 = local_b20 & 0xffff;
            local_a60 = local_b20 >> 8;
            local_a64 = local_b20 >> 0x18;
            uVar12 = 0;
            do {
              local_a18 = uVar12;
              uVar28 = local_b18.m_cells.m_p[local_a18];
              local_a08 = (ulong)uVar28;
              pdVar7 = this->m_pBlocks;
              iVar16 = 0;
              do {
                local_a5c = iVar16;
                local_9f8 = this->m_pDst_elements;
                local_a00 = (ulong)(this->m_elements_per_block * uVar28);
                local_9f8[local_a00].m_low_color[0] = (uint8)local_b20;
                local_9f8[local_a00].m_low_color[1] = (uint8)(local_b20 >> 8);
                local_9f8[local_a00].m_high_color[0] = (uint8)local_aec;
                local_9f8[local_a00].m_high_color[1] = (uint8)(local_b20 >> 0x18);
                local_a4c = (uint)(byte)local_ab8.first.m_pTable;
                local_a50 = (uint)local_ab8.first.m_pTable._1_1_;
                local_a54 = (uint)local_ab8.first.m_pTable._2_1_;
                local_ac0 = (uint)local_ab8.first.m_pTable._4_1_;
                local_ac4 = (uint)local_ab8.first.m_pTable._5_1_;
                local_acc = (uint)(byte)local_ab8.first._12_1_;
                local_ad0 = (uint)(byte)local_ab8.first._13_1_;
                local_ad4 = (uint)(byte)local_ab8.first._14_1_;
                local_a58 = (this->m_params).m_dxt1a_alpha_threshold;
                lVar14 = 0x40;
                uVar23 = 0;
                do {
                  bVar2 = *(byte *)((long)(pdVar7[local_a08].m_pixels + -1) + 0xc + lVar14);
                  uVar18 = (uint)bVar2;
                  bVar3 = *(byte *)((long)(pdVar7[local_a08].m_pixels + -1) + 0xd + lVar14);
                  uVar30 = (uint)bVar3;
                  bVar4 = *(byte *)((long)(pdVar7[local_a08].m_pixels + -1) + 0xe + lVar14);
                  uVar29 = (uint)bVar4;
                  iVar24 = bVar2 - local_a4c;
                  iVar16 = uVar30 - local_a50;
                  iVar20 = uVar29 - local_a54;
                  uVar25 = local_ab8.first.m_index >> 8 & 0xff;
                  uVar27 = local_ab8.first.m_index >> 0x10 & 0xff;
                  if ((this->m_params).m_perceptual == false) {
                    uVar21 = iVar20 * iVar20 + iVar16 * iVar16 + iVar24 * iVar24;
                    iVar16 = bVar2 - local_ac0;
                    iVar20 = bVar3 - local_ac4;
                    iVar24 = (uint)bVar4 - (uint)local_ab8.first.m_pTable._6_1_;
                    uVar17 = iVar24 * iVar24 + iVar20 * iVar20 + iVar16 * iVar16;
                    iVar16 = uVar18 - (local_ab8.first.m_index & 0xff);
                    iVar20 = uVar30 - uVar25;
                    iVar24 = uVar29 - uVar27;
                    uVar25 = iVar24 * iVar24 + iVar20 * iVar20 + iVar16 * iVar16;
                    uVar27 = uVar17;
                    if (uVar17 >= uVar21) {
                      uVar27 = uVar21;
                    }
                    uVar22 = 2;
                    if (uVar27 <= uVar25) {
                      uVar22 = (uint)(uVar17 < uVar21);
                    }
                    if (local_ac8 <= local_aec) goto LAB_00138d85;
                    if (uVar25 < uVar27) {
                      uVar27 = uVar25;
                    }
                    uVar18 = (uVar29 - local_ad4) * (uVar29 - local_ad4) +
                             (uVar30 - local_ad0) * (uVar30 - local_ad0) +
                             (uVar18 - local_acc) * (uVar18 - local_acc);
LAB_00138d79:
                    uVar29 = 3;
                    if (uVar27 <= uVar18) goto LAB_00138d9a;
                  }
                  else {
                    uVar21 = iVar20 * iVar20 + iVar16 * iVar16 * 0x19 + iVar24 * iVar24 * 8;
                    iVar16 = uVar29 - local_ab8.first.m_pTable._6_1_;
                    uVar17 = iVar16 * iVar16 +
                             (uVar30 - local_ac4) * (uVar30 - local_ac4) * 0x19 +
                             (uVar18 - local_ac0) * (uVar18 - local_ac0) * 8;
                    iVar16 = uVar18 - (local_ab8.first.m_index & 0xff);
                    iVar20 = uVar30 - uVar25;
                    iVar24 = uVar29 - uVar27;
                    uVar25 = iVar24 * iVar24 + iVar20 * iVar20 * 0x19 + iVar16 * iVar16 * 8;
                    uVar27 = uVar17;
                    if (uVar17 >= uVar21) {
                      uVar27 = uVar21;
                    }
                    uVar22 = 2;
                    if (uVar27 <= uVar25) {
                      uVar22 = (uint)(uVar17 < uVar21);
                    }
                    if (local_aec < local_ac8) {
                      if (uVar25 < uVar27) {
                        uVar27 = uVar25;
                      }
                      uVar18 = (uVar29 - local_ad4) * (uVar29 - local_ad4) +
                               (uVar30 - local_ad0) * (uVar30 - local_ad0) * 0x19 +
                               (uVar18 - local_acc) * (uVar18 - local_acc) * 8;
                      goto LAB_00138d79;
                    }
LAB_00138d85:
                    if (*(byte *)((long)(pdVar7[local_a08].m_pixels + -1) + 0xf + lVar14) <
                        local_a58) {
                      uVar22 = 3;
                    }
LAB_00138d9a:
                    uVar29 = uVar22;
                  }
                  uVar23 = uVar23 << 2 | uVar29;
                  lVar14 = lVar14 + -4;
                } while (lVar14 != 0);
                *(uint *)local_9f8[local_a00].m_selectors = uVar23;
                this = local_a10;
                iVar16 = local_a5c + 1;
              } while (local_a5c + 1 != 0x10);
              uVar12 = local_a18 + 1;
            } while (local_a18 + 1 < (local_b18.m_cells._8_8_ & 0xffffffff));
          }
        }
      }
      local_af8 = local_af8 + 1;
    } while (local_af8 < (this->m_endpoint_cluster_indices).m_size);
    if (local_b18.m_cells.m_p != (uint *)0x0) {
      crnlib_free(local_b18.m_cells.m_p);
    }
  }
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&local_9d0);
  if (local_a98.m_p != (uint8 *)0x0) {
    crnlib_free(local_a98.m_p);
  }
  if (local_a88.m_p != (color_quad_u8 *)0x0) {
    crnlib_free(local_a88.m_p);
  }
  return;
}

Assistant:

void qdxt1::pack_endpoints_task(uint64 data, void*)
    {
        const uint thread_index = static_cast<uint>(data);

        crnlib::vector<color_quad_u8> cluster_pixels;
        cluster_pixels.reserve(1024);

        crnlib::vector<uint8> selectors;
        selectors.reserve(1024);

        dxt1_endpoint_optimizer optimizer;
        dxt1_endpoint_optimizer::params p;
        dxt1_endpoint_optimizer::results r;

        p.m_quality = m_params.m_dxt_quality;
        p.m_use_alpha_blocks = m_params.m_use_alpha_blocks;
        p.m_dxt1a_alpha_threshold = m_params.m_dxt1a_alpha_threshold;
        p.m_perceptual = m_params.m_perceptual;

        uint cluster_index_progress_mask = math::next_pow2(m_endpoint_cluster_indices.size() / 100);
        cluster_index_progress_mask /= 2;
        cluster_index_progress_mask = math::maximum<uint>(cluster_index_progress_mask, 8);
        cluster_index_progress_mask -= 1;

        cluster_id cid;
        const crnlib::vector<uint32>& indices = cid.m_cells;

        for (uint cluster_index = 0; cluster_index < m_endpoint_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & cluster_index_progress_mask) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, m_endpoint_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& cluster_indices = m_endpoint_cluster_indices[cluster_index];

            selectors.resize(cluster_indices.size() * cDXTBlockSize * cDXTBlockSize);

            bool found = false;
            uint32 found_endpoints = 0;

            cid.set(cluster_indices);

            {
                scoped_spinlock lock(m_cluster_hash_lock);

                cluster_hash::const_iterator it(m_cluster_hash.find(cid));
                if (it != m_cluster_hash.end())
                {
                    CRNLIB_ASSERT(cid == it->first);

                    found = true;
                    found_endpoints = it->second;
                }
            }

            if (found)
            {
                const uint16 low_color = static_cast<uint16>(found_endpoints);
                const uint16 high_color = static_cast<uint16>((found_endpoints >> 16U));

                color_quad_u8 block_colors[4];
                dxt1_block::get_block_colors(block_colors, low_color, high_color);

                const bool is_alpha_block = (low_color <= high_color);

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    const color_quad_u8* pSrc_pixels = &m_pBlocks[block_index].m_pixels[0][0];

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        dxt1_block& dxt_block = get_block(block_index);

                        dxt_block.set_low_color(static_cast<uint16>(low_color));
                        dxt_block.set_high_color(static_cast<uint16>(high_color));

                        uint mask = 0;
                        for (int i = 15; i >= 0; i--)
                        {
                            mask <<= 2;

                            const color_quad_u8& c = pSrc_pixels[i];

                            uint dist0 = color::color_distance(m_params.m_perceptual, c, block_colors[0], false);
                            uint dist1 = color::color_distance(m_params.m_perceptual, c, block_colors[1], false);
                            uint dist2 = color::color_distance(m_params.m_perceptual, c, block_colors[2], false);

                            uint selector = 0, best_dist = dist0;

                            if (dist1 < best_dist)
                            {
                                selector = 1;
                                best_dist = dist1;
                            }
                            if (dist2 < best_dist)
                            {
                                selector = 2;
                                best_dist = dist2;
                            }

                            if (!is_alpha_block)
                            {
                                uint dist3 = color::color_distance(m_params.m_perceptual, c, block_colors[3], false);
                                if (dist3 < best_dist)
                                {
                                    selector = 3;
                                }
                            }
                            else
                            {
                                if (c.a < m_params.m_dxt1a_alpha_threshold)
                                {
                                    selector = 3;
                                }
                            }

                            mask |= selector;
                        }

                        dxt_block.m_selectors[0] = static_cast<uint8>(mask & 0xFF);
                        dxt_block.m_selectors[1] = static_cast<uint8>((mask >> 8) & 0xFF);
                        dxt_block.m_selectors[2] = static_cast<uint8>((mask >> 16) & 0xFF);
                        dxt_block.m_selectors[3] = static_cast<uint8>((mask >> 24) & 0xFF);
                    }
                }
            }
            else
            {
                cluster_pixels.resize(indices.size() * cDXTBlockSize * cDXTBlockSize);

                color_quad_u8* pDst = &cluster_pixels[0];

                bool has_alpha_pixels = false;

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    //const color_quad_u8* pSrc_pixels = &m_pBlocks[block_index].m_pixels[0][0];
                    const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        const color_quad_u8& src = pSrc_pixels[i];

                        if (src.a < m_params.m_dxt1a_alpha_threshold)
                        {
                            has_alpha_pixels = true;
                        }

                        *pDst++ = src;
                    }
                }

                p.m_block_index = cluster_index;
                p.m_num_pixels = cluster_pixels.size();
                p.m_pPixels = cluster_pixels.begin();

                r.m_pSelectors = selectors.begin();

                uint low_color, high_color;
                if ((m_params.m_dxt_quality != cCRNDXTQualitySuperFast) || (has_alpha_pixels))
                {
                    p.m_pixels_have_alpha = has_alpha_pixels;

                    optimizer.compute(p, r);
                    low_color = r.m_low_color;
                    high_color = r.m_high_color;
                }
                else
                {
                    dxt_fast::compress_color_block(cluster_pixels.size(), cluster_pixels.begin(), low_color, high_color, selectors.begin(), true);
                }

                const uint8* pSrc_selectors = selectors.begin();

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    dxt1_block& dxt_block = get_block(block_index);

                    dxt_block.set_low_color(static_cast<uint16>(low_color));
                    dxt_block.set_high_color(static_cast<uint16>(high_color));

                    uint mask = 0;
                    for (int i = 15; i >= 0; i--)
                    {
                        mask <<= 2;
                        mask |= pSrc_selectors[i];
                    }
                    pSrc_selectors += (cDXTBlockSize * cDXTBlockSize);

                    dxt_block.m_selectors[0] = static_cast<uint8>(mask & 0xFF);
                    dxt_block.m_selectors[1] = static_cast<uint8>((mask >> 8) & 0xFF);
                    dxt_block.m_selectors[2] = static_cast<uint8>((mask >> 16) & 0xFF);
                    dxt_block.m_selectors[3] = static_cast<uint8>((mask >> 24) & 0xFF);
                }

                {
                    scoped_spinlock lock(m_cluster_hash_lock);

                    m_cluster_hash.insert(cid, low_color | (high_color << 16));
                }
            }
        }
    }